

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.h
# Opt level: O3

void __thiscall Assimp::ASE::Mesh::Mesh(Mesh *this,string *name)

{
  (this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
  super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
  super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
  super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BaseNode::BaseNode(&this->super_BaseNode,Mesh,name);
  memset(this->amTexCoords,0,0x108);
  this->iMaterialIndex = 0xffffffff;
  this->bSkip = false;
  this->mNumUVComponents[0] = 2;
  this->mNumUVComponents[1] = 2;
  this->mNumUVComponents[2] = 2;
  this->mNumUVComponents[3] = 2;
  this->mNumUVComponents[4] = 2;
  this->mNumUVComponents[5] = 2;
  this->mNumUVComponents[6] = 2;
  this->mNumUVComponents[7] = 2;
  return;
}

Assistant:

explicit Mesh(const std::string &name)
    : BaseNode( BaseNode::Mesh, name )
    , mVertexColors()
    , mBoneVertices()
    , mBones()
    , iMaterialIndex(Face::DEFAULT_MATINDEX)
    , bSkip     (false) {
        for (unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c) {
            this->mNumUVComponents[c] = 2;
        }
    }